

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cc
# Opt level: O2

void __thiscall Database::initSlices(Database *this)

{
  uint __line;
  __off_t _Var1;
  int iVar2;
  DatabaseMetadata *pDVar3;
  char **ppcVar4;
  char *__assertion;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> filename;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  stat st;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&st,
                 &this->file_prefix,".metadata");
  iVar2 = open((char *)st.st_dev,0x42,0x1a4);
  this->metadata_fd = iVar2;
  std::__cxx11::string::~string((string *)&st);
  if (this->metadata_fd < 1) {
    __assertion = "metadata_fd > 0";
    __line = 0x4a;
  }
  else {
    st.__glibc_reserved[1] = 0;
    st.__glibc_reserved[2] = 0;
    st.st_blocks = 0;
    st.st_atim.tv_sec = 0;
    st.st_atim.tv_nsec = 0;
    st.st_mtim.tv_sec = 0;
    st.st_mtim.tv_nsec = 0;
    st.st_ctim.tv_sec = 0;
    st.st_ctim.tv_nsec = 0;
    st.__glibc_reserved[0] = 0;
    st.st_dev = 0;
    st.st_ino = 0;
    st.st_nlink = 0;
    st.st_mode = 0;
    st.st_uid = 0;
    st.st_gid = 0;
    st.__pad0 = 0;
    st.st_rdev = 0;
    st.st_size = 0;
    st.st_blksize = 0;
    fstat(this->metadata_fd,(stat *)&st);
    _Var1 = st.st_size;
    if (st.st_size == 0) {
      ftruncate(this->metadata_fd,0xc);
    }
    pDVar3 = (DatabaseMetadata *)mmap((void *)0x0,0x1000,3,1,this->metadata_fd,0);
    this->metadata = pDVar3;
    if (pDVar3 != (DatabaseMetadata *)0xffffffffffffffff) {
      if (_Var1 == 0) {
        pDVar3->sliceCount = 0;
        iVar2 = createNewSlice(this);
        this->slice_fd[0] = iVar2;
        mapSlice(this,iVar2,0);
        ppcVar4 = this->slices;
      }
      else {
        for (uVar5 = 0; uVar5 < pDVar3->sliceCount; uVar5 = uVar5 + 1) {
          std::operator+(&local_108,&this->file_prefix,".");
          std::__cxx11::to_string(&local_128,(int)uVar5);
          std::operator+(&local_e8,&local_108,&local_128);
          std::operator+(&filename,&local_e8,".data");
          std::__cxx11::string::~string((string *)&local_e8);
          std::__cxx11::string::~string((string *)&local_128);
          std::__cxx11::string::~string((string *)&local_108);
          iVar2 = open(filename._M_dataplus._M_p,2,0x1a4);
          this->slice_fd[uVar5] = iVar2;
          if (iVar2 < 1) {
            __assertion = "slice_fd[i] > 0";
            __line = 0x61;
            goto LAB_00104230;
          }
          mapSlice(this,iVar2,(int)uVar5);
          std::__cxx11::string::~string((string *)&filename);
          pDVar3 = this->metadata;
        }
        ppcVar4 = this->slices + (pDVar3->sliceCount - 1);
      }
      this->currentSlice = *ppcVar4;
      return;
    }
    __assertion = "metadata != MAP_FAILED";
    __line = 0x56;
  }
LAB_00104230:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/engine_race/database.cc"
                ,__line,"void Database::initSlices()");
}

Assistant:

void Database::initSlices() {
    metadata_fd = open((file_prefix + ".metadata").c_str(), O_RDWR|O_CREAT, 0644);
    assert(metadata_fd > 0);
    struct stat st = {};
    fstat(metadata_fd, &st);

    bool need_init = false;

    if (st.st_size == 0) {
        ftruncate(metadata_fd, sizeof(DatabaseMetadata));
        need_init = true;
    }

    metadata = reinterpret_cast<DatabaseMetadata*>(mmap(nullptr, 4096, PROT_READ | PROT_WRITE, MAP_SHARED, metadata_fd, 0));
    assert(metadata != MAP_FAILED);

    if (need_init) {
        metadata->sliceCount = 0;
        slice_fd[0] = createNewSlice();
        mapSlice(slice_fd[0], 0);
        currentSlice = slices[0];
    } else {
        for (int i = 0; i < metadata->sliceCount; ++i) {
            auto filename = file_prefix + "." + std::to_string(i) + ".data";
            slice_fd[i] = open(filename.c_str(), O_RDWR, 0644);
            assert(slice_fd[i] > 0);
            mapSlice(slice_fd[i], i);
        }
//        printf("%d %d %d\n", *sliceCount, *currentSliceNumber, *currentOffset);
        currentSlice = slices[metadata->sliceCount - 1];
    }


}